

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O3

bool __thiscall
Rml::FontEffectOutline::GetGlyphMetrics
          (FontEffectOutline *this,Vector2i *origin,Vector2i *dimensions,FontGlyph *param_3)

{
  int iVar1;
  int iVar2;
  Vector2i VVar3;
  Vector2i VVar4;
  
  iVar2 = dimensions->y * dimensions->x;
  if (0 < iVar2) {
    iVar1 = this->width;
    VVar3.x = (*origin).x - iVar1;
    VVar3.y = (*origin).y - iVar1;
    *origin = VVar3;
    VVar4.x = iVar1 * 2 + (*dimensions).x;
    VVar4.y = iVar1 * 2 + (*dimensions).y;
    *dimensions = VVar4;
  }
  return 0 < iVar2;
}

Assistant:

bool FontEffectOutline::GetGlyphMetrics(Vector2i& origin, Vector2i& dimensions, const FontGlyph& /*glyph*/) const
{
	if (dimensions.x * dimensions.y > 0)
	{
		origin.x -= width;
		origin.y -= width;

		dimensions.x += 2 * width;
		dimensions.y += 2 * width;

		return true;
	}

	return false;
}